

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateBinaryOp(ExpressionContext *ctx,SynBase *source,SynBinaryOpType op,ExprBase *lhs,ExprBase *rhs
              )

{
  long lVar1;
  SynBase *pSVar2;
  ScopeData *pSVar3;
  TypeBase *type;
  IntrusiveList<TypeHandle> arguments;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  TypeStruct *pTVar8;
  undefined4 extraout_var_00;
  TypeFunction *pTVar9;
  undefined4 extraout_var_01;
  ExprBase *arg1;
  TypeBase *pTVar10;
  ScopeData *pSVar11;
  size_t sVar12;
  char *pcVar13;
  ExprError *pEVar14;
  TypeRef *type_00;
  undefined4 extraout_var_03;
  byte bVar15;
  char *pcVar16;
  TypeStruct *pTVar17;
  ScopeData *pSVar18;
  char *pcVar19;
  bool bVar20;
  byte bVar21;
  TypeStruct *type_01;
  uint *this;
  ScopeData *pSVar22;
  uint uVar23;
  TypeRef *rhsTypeRef;
  bool bVar24;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  IntrusiveList<TypeHandle> types;
  TypeHandle *node;
  undefined4 extraout_var_02;
  
  type_01 = (TypeStruct *)lhs->type;
  if (((type_01 != (TypeStruct *)0x0) && ((type_01->super_TypeBase).typeID == 0)) ||
     ((pTVar17 = (TypeStruct *)rhs->type, pTVar17 != (TypeStruct *)0x0 &&
      ((pTVar17->super_TypeBase).typeID == 0)))) {
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar7->typeID = 0x14;
    pEVar7->source = source;
    pEVar7->type = pTVar10;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223be0;
    *(SynBinaryOpType *)&pEVar7->field_0x2c = op;
    pEVar7[1]._vptr_ExprBase = (_func_int **)lhs;
    *(ExprBase **)&pEVar7[1].typeID = rhs;
    return pEVar7;
  }
  if (op == SYN_BINARY_OP_IN) {
    pcVar19 = "in";
    pcVar16 = "";
    bVar4 = false;
    bVar24 = false;
    goto LAB_0014eb42;
  }
  uVar5 = op - SYN_BINARY_OP_EQUAL;
  if (uVar5 < 2) {
    if (type_01 != pTVar17) {
      pTVar8 = (TypeStruct *)ctx->typeNullPtr;
      if (type_01 == pTVar8) {
        lhs = CreateCast(ctx,source,lhs,(TypeBase *)pTVar17,false);
        pTVar17 = (TypeStruct *)rhs->type;
        pTVar8 = (TypeStruct *)ctx->typeNullPtr;
      }
      if (pTVar17 == pTVar8) {
        rhs = CreateCast(ctx,source,rhs,lhs->type,false);
      }
    }
    type_01 = (TypeStruct *)lhs->type;
    if ((type_01 == ctx->typeAutoRef) && (type_01 == (TypeStruct *)rhs->type)) {
      pcVar19 = "__rncomp";
      if (op == SYN_BINARY_OP_EQUAL) {
        pcVar19 = "__rcomp";
      }
      lVar1 = (long)pcVar19 - (ulong)(op == SYN_BINARY_OP_EQUAL);
LAB_0014f205:
      pcVar16 = (char *)(lVar1 + 8);
      bVar4 = true;
      bVar24 = true;
LAB_0014eb42:
      name.end = pcVar16;
      name.begin = pcVar19;
      pEVar7 = CreateFunctionCall2(ctx,source,name,lhs,rhs,false,bVar24,bVar4);
      return pEVar7;
    }
    if (type_01 != (TypeStruct *)0x0) {
      uVar23 = (type_01->super_TypeBase).typeID;
      if (uVar23 == 0x14) {
        if (type_01 == (TypeStruct *)rhs->type) {
          pcVar16 = GetOpName(op);
          sVar12 = strlen(pcVar16);
          name_04.end = pcVar16 + sVar12;
          name_04.begin = pcVar16;
          pEVar7 = CreateFunctionCall2(ctx,source,name_04,lhs,rhs,true,false,true);
          if (pEVar7 != (ExprBase *)0x0) {
            return pEVar7;
          }
          pcVar19 = "__ancomp";
          if (op == SYN_BINARY_OP_EQUAL) {
            pcVar19 = "__acomp";
          }
          lVar1 = (long)pcVar19 - (ulong)(op == SYN_BINARY_OP_EQUAL);
          goto LAB_0014f205;
        }
      }
      else if ((uVar23 == 0x15) && (type_01 == (TypeStruct *)rhs->type)) {
        types.head = (TypeHandle *)0x0;
        types.tail = (TypeHandle *)0x0;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        node = (TypeHandle *)CONCAT44(extraout_var_00,iVar6);
        node->type = ctx->typeInt;
        node->next = (TypeHandle *)0x0;
        node->listed = false;
        IntrusiveList<TypeHandle>::push_back(&types,node);
        arguments.tail = types.tail;
        arguments.head = types.head;
        pTVar9 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments);
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar6);
        pSVar2 = lhs->source;
        pEVar7->typeID = 0x12;
        pEVar7->source = pSVar2;
        pEVar7->type = &pTVar9->super_TypeBase;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002239e8;
        pEVar7[1]._vptr_ExprBase = (_func_int **)lhs;
        pEVar7[1].typeID = 0xd;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        arg1 = (ExprBase *)CONCAT44(extraout_var_02,iVar6);
        pSVar2 = rhs->source;
        arg1->typeID = 0x12;
        arg1->source = pSVar2;
        arg1->type = &pTVar9->super_TypeBase;
        arg1->next = (ExprBase *)0x0;
        arg1->listed = false;
        arg1->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002239e8;
        arg1[1]._vptr_ExprBase = (_func_int **)rhs;
        arg1[1].typeID = 0xd;
        pcVar16 = "__pncomp";
        if (op == SYN_BINARY_OP_EQUAL) {
          pcVar16 = "__pcomp";
        }
        name_00.end = pcVar16 + (8 - (ulong)(op == SYN_BINARY_OP_EQUAL));
        name_00.begin = pcVar16;
        pEVar7 = CreateFunctionCall2(ctx,source,name_00,pEVar7,arg1,false,true,true);
        return pEVar7;
      }
    }
    if (type_01 == (TypeStruct *)ctx->typeTypeID) {
      bVar24 = (TypeStruct *)rhs->type == type_01;
      bVar15 = 0;
    }
    else {
      bVar15 = 0;
      bVar24 = false;
    }
  }
  else {
    if (op == SYN_BINARY_OP_LOGICAL_XOR) {
      if ((type_01 != (TypeStruct *)0x0) && ((type_01->super_TypeBase).typeID == 0x18)) {
        pcVar16 = GetOpName(SYN_BINARY_OP_LOGICAL_XOR);
        sVar12 = strlen(pcVar16);
        name_01.end = pcVar16 + sVar12;
        name_01.begin = pcVar16;
        pEVar7 = CreateFunctionCall2(ctx,source,name_01,lhs,rhs,true,false,true);
        if (pEVar7 != (ExprBase *)0x0) {
          return pEVar7;
        }
      }
LAB_0014edf1:
      lhs = CreateConditionCast(ctx,lhs->source,lhs);
      rhs = CreateConditionCast(ctx,rhs->source,rhs);
      type_01 = (TypeStruct *)lhs->type;
      bVar15 = 1;
    }
    else {
      if (op - SYN_BINARY_OP_LOGICAL_AND < 3) goto LAB_0014edf1;
      bVar15 = 0;
    }
    bVar24 = false;
  }
  if (type_01 == (TypeStruct *)ctx->typeVoid) {
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar16 = "ERROR: first operand type is \'void\'";
LAB_0014eeaf:
    pEVar14 = anon_unknown.dwarf_9c70f::ReportExpected(ctx,source,pTVar10,pcVar16);
    return &pEVar14->super_ExprBase;
  }
  pTVar17 = (TypeStruct *)rhs->type;
  if (pTVar17 == (TypeStruct *)ctx->typeVoid) {
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar16 = "ERROR: second operand type is \'void\'";
    goto LAB_0014eeaf;
  }
  bVar4 = ExpressionContext::IsNumericType(ctx,&type_01->super_TypeBase);
  if (bVar4) {
    bVar4 = ExpressionContext::IsNumericType(ctx,(TypeBase *)pTVar17);
  }
  else {
    bVar4 = false;
  }
  if (type_01 == (TypeStruct *)0x0) {
    bVar20 = bVar4;
    if ((uVar5 < 2) &&
       (bVar20 = true,
       (TypeStruct *)ctx->typeTypeID != pTVar17 ||
       (TypeStruct *)ctx->typeTypeID != (TypeStruct *)0x0)) {
      bVar20 = bVar4;
    }
LAB_0014efbb:
    pSVar22 = (ScopeData *)0x0;
  }
  else {
    bVar20 = (bool)(bVar4 | (type_01 == pTVar17 && (type_01->super_TypeBase).typeID == 0x19));
    if (1 < uVar5) goto LAB_0014efbb;
    bVar4 = true;
    if ((TypeStruct *)ctx->typeTypeID != pTVar17 || type_01 != (TypeStruct *)ctx->typeTypeID) {
      bVar4 = bVar20;
    }
    bVar20 = bVar4;
    if (type_01 == (TypeStruct *)0x0) goto LAB_0014efbb;
    pSVar22 = (ScopeData *)0x0;
    if ((pTVar17 != (TypeStruct *)0x0) && ((type_01->super_TypeBase).typeID == 0x12)) {
      if ((pTVar17->super_TypeBase).typeID == 0x12) {
        if (type_01 == pTVar17) {
          bVar20 = true;
        }
        else {
          pSVar22 = type_01->typeScope;
          if ((((pSVar22 != (ScopeData *)0x0) && (pSVar22->uniqueId == 0x18)) &&
              (pSVar3 = pTVar17->typeScope, pSVar3 != (ScopeData *)0x0)) &&
             (pSVar3->uniqueId == 0x18)) {
            do {
              pSVar18 = pSVar22;
              pSVar22 = (ScopeData *)(pSVar18->scopes).allocator;
            } while (pSVar22 != (ScopeData *)0x0);
            do {
              pSVar11 = pSVar3;
              pSVar3 = (ScopeData *)(pSVar11->scopes).allocator;
            } while (pSVar3 != (ScopeData *)0x0);
            pSVar22 = (ScopeData *)0x0;
            if (pSVar18 == pSVar11) {
              pSVar22 = pSVar18;
            }
            bVar20 = true;
            if (pSVar18 != pSVar11) {
              bVar20 = bVar4;
            }
            goto LAB_0014efbd;
          }
        }
      }
      goto LAB_0014efbb;
    }
  }
LAB_0014efbd:
  if (bVar24) {
    AssertValueExpression(ctx,lhs->source,lhs);
    AssertValueExpression(ctx,rhs->source,rhs);
    if (bVar20 == false) {
LAB_0014f173:
      pTVar10 = lhs->type;
      pcVar13 = GetOpName(op);
      pcVar16 = (lhs->type->name).begin;
      pcVar19 = (rhs->type->name).begin;
      pEVar14 = anon_unknown.dwarf_9c70f::ReportExpected
                          (ctx,source,pTVar10,
                           "ERROR: operation %s is not supported on \'%.*s\' and \'%.*s\'",pcVar13,
                           (ulong)(uint)(*(int *)&(lhs->type->name).end - (int)pcVar16),pcVar16,
                           (ulong)(uint)(*(int *)&(rhs->type->name).end - (int)pcVar19),pcVar19);
      return &pEVar14->super_ExprBase;
    }
  }
  else {
    if (bVar20 == false) {
      pcVar16 = GetOpName(op);
      sVar12 = strlen(pcVar16);
      name_03.end = pcVar16 + sVar12;
      name_03.begin = pcVar16;
      pEVar7 = CreateFunctionCall2(ctx,source,name_03,lhs,rhs,false,false,true);
      if (pEVar7 != (ExprBase *)0x0) {
        return pEVar7;
      }
      AssertValueExpression(ctx,lhs->source,lhs);
      AssertValueExpression(ctx,rhs->source,rhs);
      goto LAB_0014f173;
    }
    types.head = (TypeHandle *)type_01;
    types.tail = (TypeHandle *)pTVar17;
    if (0x14 < op - SYN_BINARY_OP_ADD) {
      __assert_fail("index < N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x115,
                    "T &FixedArray<SmallDenseSet<TypePair, TypePairHasher, 4>, 21>::operator[](unsigned int) [T = SmallDenseSet<TypePair, TypePairHasher, 4>, N = 21]"
                   );
    }
    this = &(ctx->noBinaryOperatorForTypePair).data[op - SYN_BINARY_OP_ADD].bucketCount;
    bVar24 = SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains
                       ((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)this,(TypePair *)&types);
    if (!bVar24) {
      pcVar16 = GetOpName(op);
      sVar12 = strlen(pcVar16);
      name_02.end = pcVar16 + sVar12;
      name_02.begin = pcVar16;
      pEVar7 = CreateFunctionCall2(ctx,source,name_02,lhs,rhs,true,false,true);
      if (pEVar7 != (ExprBase *)0x0) {
        return pEVar7;
      }
      SmallDenseSet<TypePair,_TypePairHasher,_4U>::insert
                ((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)this,(TypePair *)&types);
    }
    AssertValueExpression(ctx,lhs->source,lhs);
    AssertValueExpression(ctx,rhs->source,rhs);
  }
  bVar21 = (byte)(0x38180 >> ((byte)op & 0x1f)) & op < SYN_BINARY_OP_LOGICAL_AND;
  pTVar10 = lhs->type;
  if (ctx->typeDouble == pTVar10 || ctx->typeFloat == pTVar10) {
    if ((bVar15 | bVar21) == 1) {
LAB_0014f230:
      pcVar13 = GetOpName(op);
      pcVar16 = (lhs->type->name).begin;
      uVar5 = *(int *)&(lhs->type->name).end - (int)pcVar16;
      pcVar19 = (rhs->type->name).begin;
      uVar23 = *(int *)&(rhs->type->name).end - (int)pcVar19;
      goto LAB_0014f407;
    }
  }
  else if (((bVar15 | bVar21) == 1) && (ctx->typeFloat == rhs->type || ctx->typeDouble == rhs->type)
          ) goto LAB_0014f230;
  if (bVar15 == 0) {
    bVar24 = ExpressionContext::IsNumericType(ctx,pTVar10);
    if (bVar24) {
      type = rhs->type;
      bVar24 = ExpressionContext::IsNumericType(ctx,type);
      if (!bVar24) goto LAB_0014f36b;
      type_00 = (TypeRef *)ExpressionContext::GetBinaryOpResultType(ctx,pTVar10,type);
LAB_0014f37d:
      lhs = CreateCast(ctx,source,lhs,&type_00->super_TypeBase,false);
      goto LAB_0014f39e;
    }
LAB_0014f36b:
    if (pSVar22 != (ScopeData *)0x0) {
      type_00 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pSVar22);
      goto LAB_0014f37d;
    }
  }
  else {
    lhs = CreateCast(ctx,source,lhs,ctx->typeBool,false);
    type_00 = (TypeRef *)ctx->typeBool;
LAB_0014f39e:
    rhs = CreateCast(ctx,source,rhs,&type_00->super_TypeBase,false);
  }
  pTVar10 = lhs->type;
  if (pTVar10 == rhs->type) {
    bVar24 = op - SYN_BINARY_OP_LESS < 6;
    if (bVar24 || bVar15 != 0) {
      pTVar10 = ctx->typeBool;
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_03,iVar6);
    pEVar7->typeID = 0x14;
    pEVar7->source = source;
    pEVar7->type = pTVar10;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223be0;
    *(SynBinaryOpType *)&pEVar7->field_0x2c = op;
    pEVar7[1]._vptr_ExprBase = (_func_int **)lhs;
    *(ExprBase **)&pEVar7[1].typeID = rhs;
    if ((bVar24 || bVar15 != 0) || (bVar21 != 0 || lhs->type != ctx->typeBool)) {
      return pEVar7;
    }
    pEVar7 = CreateCast(ctx,source,pEVar7,ctx->typeInt,false);
    return pEVar7;
  }
  pcVar13 = GetOpName(op);
  pcVar16 = (lhs->type->name).begin;
  uVar5 = *(int *)&(lhs->type->name).end - (int)pcVar16;
  pcVar19 = (rhs->type->name).begin;
  uVar23 = *(int *)&(rhs->type->name).end - (int)pcVar19;
LAB_0014f407:
  pEVar14 = anon_unknown.dwarf_9c70f::ReportExpected
                      (ctx,source,pTVar10,
                       "ERROR: operation %s is not supported on \'%.*s\' and \'%.*s\'",pcVar13,
                       (ulong)uVar5,pcVar16,(ulong)uVar23,pcVar19);
  return &pEVar14->super_ExprBase;
}

Assistant:

ExprBase* CreateBinaryOp(ExpressionContext &ctx, SynBase *source, SynBinaryOpType op, ExprBase *lhs, ExprBase *rhs)
{
	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(source, ctx.GetErrorType(), op, lhs, rhs);

	if(op == SYN_BINARY_OP_IN)
		return CreateFunctionCall2(ctx, source, InplaceStr("in"), lhs, rhs, false, false, false);

	bool skipOverload = false;

	// Built-in comparisons
	if(op == SYN_BINARY_OP_EQUAL || op == SYN_BINARY_OP_NOT_EQUAL)
	{
		if(lhs->type != rhs->type)
		{
			if(lhs->type == ctx.typeNullPtr)
				lhs = CreateCast(ctx, source, lhs, rhs->type, false);

			if(rhs->type == ctx.typeNullPtr)
				rhs = CreateCast(ctx, source, rhs, lhs->type, false);
		}

		if(lhs->type == ctx.typeAutoRef && lhs->type == rhs->type)
		{
			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__rcomp" : "__rncomp"), lhs, rhs, false, true, true);
		}

		if(isType<TypeFunction>(lhs->type) && lhs->type == rhs->type)
		{
			IntrusiveList<TypeHandle> types;
			types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ctx.typeInt));
			TypeBase *type = ctx.GetFunctionType(source, ctx.typeVoid, types);

			lhs = new (ctx.get<ExprTypeCast>()) ExprTypeCast(lhs->source, type, lhs, EXPR_CAST_REINTERPRET);
			rhs = new (ctx.get<ExprTypeCast>()) ExprTypeCast(rhs->source, type, rhs, EXPR_CAST_REINTERPRET);

			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__pcomp" : "__pncomp"), lhs, rhs, false, true, true);
		}

		if(isType<TypeUnsizedArray>(lhs->type) && lhs->type == rhs->type)
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
				return result;

			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__acomp" : "__ancomp"), lhs, rhs, false, true, true);
		}

		if(lhs->type == ctx.typeTypeID && rhs->type == ctx.typeTypeID)
			skipOverload = true;
	}

	if(!skipOverload)
	{
		// For ^^ try to find a function before generic condition casts to bool
		if(op == SYN_BINARY_OP_LOGICAL_XOR && isType<TypeClass>(lhs->type))
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
				return result;
		}
	}

	// Promotion to bool for some types
	if(op == SYN_BINARY_OP_LOGICAL_AND || op == SYN_BINARY_OP_LOGICAL_OR || op == SYN_BINARY_OP_LOGICAL_XOR)
	{
		lhs = CreateConditionCast(ctx, lhs->source, lhs);
		rhs = CreateConditionCast(ctx, rhs->source, rhs);
	}

	if(lhs->type == ctx.typeVoid)
		return ReportExpected(ctx, source, ctx.GetErrorType(), "ERROR: first operand type is 'void'");

	if(rhs->type == ctx.typeVoid)
		return ReportExpected(ctx, source, ctx.GetErrorType(), "ERROR: second operand type is 'void'");

	bool hasBuiltIn = false;

	hasBuiltIn |= ctx.IsNumericType(lhs->type) && ctx.IsNumericType(rhs->type);
	hasBuiltIn |= isType<TypeEnum>(lhs->type) && lhs->type == rhs->type;

	TypeBase *commonBaseClass = NULL;

	if(op == SYN_BINARY_OP_EQUAL || op == SYN_BINARY_OP_NOT_EQUAL)
	{
		if(lhs->type == ctx.typeTypeID && rhs->type == ctx.typeTypeID)
			hasBuiltIn = true;

		if(isType<TypeRef>(lhs->type) && isType<TypeRef>(rhs->type))
		{
			TypeRef *lhsTypeRef = getType<TypeRef>(lhs->type);
			TypeRef *rhsTypeRef = getType<TypeRef>(rhs->type);

			if(lhs->type == rhs->type)
			{
				hasBuiltIn = true;
			}
			else if(isType<TypeClass>(lhsTypeRef->subType) && isType<TypeClass>(rhsTypeRef->subType))
			{
				TypeClass *lhsTypeClass = getType<TypeClass>(lhsTypeRef->subType);
				TypeClass *rhsTypeClass = getType<TypeClass>(rhsTypeRef->subType);

				while(lhsTypeClass->baseClass)
					lhsTypeClass = lhsTypeClass->baseClass;

				while(rhsTypeClass->baseClass)
					rhsTypeClass = rhsTypeClass->baseClass;

				if(lhsTypeClass == rhsTypeClass)
				{
					hasBuiltIn = true;

					commonBaseClass = lhsTypeClass;
				}
			}
		}
	}

	if(!skipOverload)
	{
		if(!hasBuiltIn)
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, false, false, true))
				return result;
		}
		else
		{
			TypePair typePair(lhs->type, rhs->type);

			if(!ctx.noBinaryOperatorForTypePair[int(op) - 1].contains(typePair))
			{
				if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
					return result;
				else
					ctx.noBinaryOperatorForTypePair[int(op) - 1].insert(typePair);
			}
		}
	}

	AssertValueExpression(ctx, lhs->source, lhs);
	AssertValueExpression(ctx, rhs->source, rhs);

	if(!hasBuiltIn)
		return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));

	bool binaryOp = IsBinaryOp(op);
	bool comparisonOp = IsComparisonOp(op);
	bool logicalOp = IsLogicalOp(op);

	if(ctx.IsFloatingPointType(lhs->type) || ctx.IsFloatingPointType(rhs->type))
	{
		if(logicalOp || binaryOp)
			return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));
	}

	if(logicalOp)
	{
		// Logical operations require both operands to be 'bool'
		lhs = CreateCast(ctx, source, lhs, ctx.typeBool, false);
		rhs = CreateCast(ctx, source, rhs, ctx.typeBool, false);
	}
	else if(ctx.IsNumericType(lhs->type) && ctx.IsNumericType(rhs->type))
	{
		// Numeric operations promote both operands to a common type
		TypeBase *commonType = ctx.GetBinaryOpResultType(lhs->type, rhs->type);

		lhs = CreateCast(ctx, source, lhs, commonType, false);
		rhs = CreateCast(ctx, source, rhs, commonType, false);
	}
	else if(commonBaseClass)
	{
		TypeBase *commonType = ctx.GetReferenceType(commonBaseClass);

		lhs = CreateCast(ctx, source, lhs, commonType, false);
		rhs = CreateCast(ctx, source, rhs, commonType, false);
	}

	if(lhs->type != rhs->type)
		return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));

	TypeBase *resultType = NULL;

	if(comparisonOp || logicalOp)
		resultType = ctx.typeBool;
	else
		resultType = lhs->type;

	ExprBase *result = new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(source, resultType, op, lhs, rhs);

	// Arithmetic operation on bool results in an int
	if(lhs->type == ctx.typeBool && !binaryOp && !comparisonOp && !logicalOp)
		return CreateCast(ctx, source, result, ctx.typeInt, false);

	return result;
}